

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd_filter.cc
# Opt level: O3

void __thiscall sptk::reaper::FdFilter::MakeLinearFir(FdFilter *this,float fc,int *nf,float *coef)

{
  uint uVar1;
  float *pfVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  double dVar7;
  
  uVar6 = *nf;
  if ((uVar6 & 0x80000001) != 1) {
    uVar6 = uVar6 + 1;
    *nf = uVar6;
  }
  uVar3 = (int)((uVar6 - ((int)(uVar6 + 1) >> 0x1f)) + 1) >> 1;
  *coef = fc + fc;
  uVar1 = uVar6;
  if (2 < (int)uVar6) {
    uVar4 = 2;
    if (2 < (int)uVar3) {
      uVar4 = (ulong)uVar3;
    }
    uVar5 = 1;
    do {
      dVar7 = sin((double)fc * 6.283185307179586 * (double)(int)uVar5);
      coef[uVar5] = (float)(dVar7 / ((double)(int)uVar5 * 3.141592653589793));
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
    uVar1 = *nf;
  }
  if (0 < (int)uVar6) {
    uVar4 = 1;
    if (1 < (int)uVar3) {
      uVar4 = (ulong)uVar3;
    }
    pfVar2 = coef + uVar3;
    uVar5 = 0;
    do {
      pfVar2 = pfVar2 + -1;
      dVar7 = cos(((double)(int)uVar5 + 0.5) * (6.283185307179586 / (double)(int)uVar1));
      *pfVar2 = (float)((double)*pfVar2 * (dVar7 * -0.5 + 0.5));
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
  }
  return;
}

Assistant:

void FdFilter::MakeLinearFir(float fc, int *nf, float *coef) {
  int i, n;
  double twopi, fn, c;

  if (((*nf % 2) != 1))
    *nf = *nf + 1;
  n = (*nf + 1) / 2;

  /*  Compute part of the ideal impulse response (the sin(x)/x kernel). */
  twopi = M_PI * 2.0;
  coef[0] = 2.0 * fc;
  c = M_PI;
  fn = twopi * fc;
  for (i = 1; i < n; i++)
    coef[i] = sin(i * fn) / (c * i);

  /* Now apply a Hanning window to the (infinite) impulse response. */
  /* (Could use other windows, like Kaiser, Gaussian...) */
  fn = twopi / *nf;
  for (i = 0; i < n; i++)
    coef[n - i - 1] *= (.5 - (.5 * cos(fn * (i + 0.5))));
}